

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::IfBlock(SQCompiler *this)

{
  SQFuncState *this_00;
  long lVar1;
  long n;
  SQInteger SVar2;
  SQInteger SVar3;
  SQInteger SVar4;
  SQScope __oldscope__;
  SQInstruction local_20;
  
  if (this->_token == 0x7b) {
    SVar2 = (this->_scope).outers;
    SVar3 = (this->_scope).stacksize;
    this_00 = this->_fs;
    (this->_scope).outers = this_00->_outers;
    SVar4 = SQFuncState::GetStackSize(this_00);
    (this->_scope).stacksize = SVar4;
    SVar4 = SQLexer::Lex(&this->_lex);
    this->_token = SVar4;
    Statements(this);
    Expect(this,0x7d);
    lVar1 = this->_fs->_outers;
    SVar4 = SQFuncState::GetStackSize(this->_fs);
    n = (this->_scope).stacksize;
    if (SVar4 != n) {
      SQFuncState::SetStackSize(this->_fs,n);
      if (lVar1 != this->_fs->_outers) {
        local_20._arg1 = (SQInt32)(this->_scope).stacksize;
        local_20.op = '<';
        local_20._arg0 = '\0';
        local_20._arg2 = '\0';
        local_20._arg3 = '\0';
        SQFuncState::AddInstruction(this->_fs,&local_20);
      }
    }
    (this->_scope).outers = SVar2;
    (this->_scope).stacksize = SVar3;
  }
  else {
    Statement(this,true);
    lVar1 = (this->_lex)._prevtoken;
    if ((lVar1 != 0x3b) && (lVar1 != 0x7d)) {
      OptionalSemicolon(this);
      return;
    }
  }
  return;
}

Assistant:

void IfBlock()
    {
        if (_token == _SC('{'))
        {
            BEGIN_SCOPE();
            Lex();
            Statements();
            Expect(_SC('}'));
            if (true) {
                END_SCOPE();
            }
            else {
                END_SCOPE_NO_CLOSE();
            }
        }
        else {
            //BEGIN_SCOPE();
            Statement();
            if (_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
            //END_SCOPE();
        }
    }